

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::RunTests(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_color _Var4;
  
  CheckResume(this);
  if (this->HasCycles == false) {
    pcVar1 = this->TestHandler;
    _Var4 = _S_red;
    for (p_Var3 = (this->Tests).
                  super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->Tests).
         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
         ._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      if ((int)_Var4 < (int)p_Var3[1]._M_color) {
        _Var4 = p_Var3[1]._M_color;
      }
    }
    pcVar1->MaxIndex = _Var4;
    while( true ) {
      StartNextTests(this);
      if ((this->Tests).
          super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        do {
          bVar2 = CheckOutput(this);
        } while (bVar2);
        MarkFinished(this);
        UpdateCostData(this);
        return;
      }
      if (this->StopTimePassed != false) break;
      CheckOutput(this);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RunTests()
{
  this->CheckResume();
  if(this->HasCycles)
    {
    return;
    }
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  this->StartNextTests();
  while(!this->Tests.empty())
    {
    if(this->StopTimePassed)
      {
      return;
      }
    this->CheckOutput();
    this->StartNextTests();
    }
  // let all running tests finish
  while(this->CheckOutput())
    {
    }
  this->MarkFinished();
  this->UpdateCostData();
}